

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  lu_byte x;
  undefined1 local_50;
  undefined7 uStack_4f;
  DumpState local_48;
  
  local_48.L = L;
  local_48.writer = w;
  local_48.data = data;
  local_48.strip = strip;
  local_48.status = (*w)(L,"\x1bLua",4,data);
  local_50 = 0x53;
  if (local_48.status == 0) {
    local_48.status = (*w)(L,&local_50,1,data);
    local_50 = 0;
    if (local_48.status == 0) {
      local_48.status = (*w)(L,&local_50,1,data);
      if (local_48.status == 0) {
        local_48.status = (*w)(L,anon_var_dwarf_bd45,6,data);
        local_50 = 4;
        if (local_48.status == 0) {
          local_48.status = (*w)(L,&local_50,1,data);
          local_50 = 8;
          if (local_48.status == 0) {
            local_48.status = (*w)(L,&local_50,1,data);
            local_50 = 4;
            if (local_48.status == 0) {
              local_48.status = (*w)(L,&local_50,1,data);
              local_50 = 8;
              if (local_48.status == 0) {
                local_48.status = (*w)(L,&local_50,1,data);
                local_50 = 8;
                if (local_48.status == 0) {
                  local_48.status = (*w)(L,&local_50,1,data);
                  local_50 = 0x78;
                  uStack_4f = 0x56;
                  if (local_48.status == 0) {
                    local_48.status = (*w)(L,&local_50,8,data);
                    local_50 = 0;
                    uStack_4f = 0x40772800000000;
                    if (local_48.status == 0) {
                      local_48.status = (*w)(L,&local_50,8,data);
                      local_50 = (undefined1)f->sizeupvalues;
                      if (local_48.status == 0) {
                        local_48.status = (*w)(L,&local_50,1,data);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  DumpFunction(f,(TString *)0x0,&local_48);
  return local_48.status;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
  DumpState D;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f, NULL);
  return D.status;
}